

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O1

int fsg_model_add_alt(fsg_model_t *fsg,char *baseword,char *altword)

{
  char **ppcVar1;
  hash_table_t *h;
  glist_t pgVar2;
  undefined4 *puVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  bitvec_t *pbVar7;
  hash_iter_t *itor;
  undefined4 *ptr;
  glist_t g;
  long lVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar6 = fsg->n_word;
  if ((int)uVar6 < 1) {
    uVar10 = 0;
  }
  else {
    ppcVar1 = fsg->vocab;
    uVar11 = 0;
    do {
      iVar4 = strcmp(ppcVar1[uVar11],baseword);
      if (iVar4 == 0) goto LAB_0012dcb0;
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
    uVar11 = (ulong)uVar6;
LAB_0012dcb0:
    uVar10 = (uint)uVar11;
  }
  if (uVar10 == uVar6) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
            ,0x1b9,"Base word %s not present in FSG vocabulary!\n",baseword);
    iVar9 = -1;
  }
  else {
    iVar4 = fsg_model_word_add(fsg,altword);
    if (fsg->altwords == (bitvec_t *)0x0) {
      iVar9 = fsg->n_word_alloc + 0x1f;
      iVar5 = fsg->n_word_alloc + 0x3e;
      if (-1 < iVar9) {
        iVar5 = iVar9;
      }
      pbVar7 = (bitvec_t *)
               __ckd_calloc__((long)(iVar5 >> 5),4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                              ,0x1be);
      fsg->altwords = pbVar7;
    }
    uVar6 = 1 << ((byte)iVar4 & 0x1f);
    iVar9 = iVar4 + 0x1f;
    if (-1 < iVar4) {
      iVar9 = iVar4;
    }
    fsg->altwords[iVar9 >> 5] = fsg->altwords[iVar9 >> 5] | uVar6;
    pbVar7 = fsg->silwords;
    if ((pbVar7 != (bitvec_t *)0x0) && ((pbVar7[uVar10 >> 5] >> (uVar10 & 0x1f) & 1) != 0)) {
      pbVar7[iVar9 >> 5] = pbVar7[iVar9 >> 5] | uVar6;
    }
    if (fsg->n_state < 1) {
      iVar9 = 0;
    }
    else {
      lVar8 = 0;
      iVar9 = 0;
      do {
        h = fsg->trans[lVar8].trans;
        if (h != (hash_table_t *)0x0) {
          for (itor = hash_table_iter(h); itor != (hash_iter_t *)0x0;
              itor = hash_table_iter_next(itor)) {
            pgVar2 = (glist_t)itor->ent->val;
            g = pgVar2;
            for (; pgVar2 != (glist_t)0x0; pgVar2 = pgVar2->next) {
              puVar3 = (undefined4 *)(pgVar2->data).ptr;
              if (puVar3[3] == uVar10) {
                ptr = (undefined4 *)
                      __listelem_malloc__(fsg->link_alloc,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                          ,0x1dc);
                *ptr = *puVar3;
                ptr[1] = puVar3[1];
                ptr[2] = puVar3[2];
                ptr[3] = iVar4;
                g = glist_add_ptr(g,ptr);
                iVar9 = iVar9 + 1;
              }
            }
            itor->ent->val = g;
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < fsg->n_state);
    }
  }
  return iVar9;
}

Assistant:

int
fsg_model_add_alt(fsg_model_t * fsg, char const *baseword,
                  char const *altword)
{
    int i, basewid, altwid;
    int ntrans;

    /* FIXME: This will get slow, eventually... */
    for (basewid = 0; basewid < fsg->n_word; ++basewid)
        if (0 == strcmp(fsg->vocab[basewid], baseword))
            break;
    if (basewid == fsg->n_word) {
        E_ERROR("Base word %s not present in FSG vocabulary!\n", baseword);
        return -1;
    }
    altwid = fsg_model_word_add(fsg, altword);
    if (fsg->altwords == NULL)
        fsg->altwords = bitvec_alloc(fsg->n_word_alloc);
    bitvec_set(fsg->altwords, altwid);
    if (fsg_model_is_filler(fsg, basewid)) {
        if (fsg->silwords == NULL)
            fsg->silwords = bitvec_alloc(fsg->n_word_alloc);
        bitvec_set(fsg->silwords, altwid);
    }

    E_DEBUG("Adding alternate word transitions (%s,%s) to FSG\n",
            baseword, altword);

    /* Look for all transitions involving baseword and duplicate them. */
    /* FIXME: This will also get slow, eventually... */
    ntrans = 0;
    for (i = 0; i < fsg->n_state; ++i) {
        hash_iter_t *itor;
        if (fsg->trans[i].trans == NULL)
            continue;
        for (itor = hash_table_iter(fsg->trans[i].trans); itor;
             itor = hash_table_iter_next(itor)) {
            glist_t trans;
            gnode_t *gn;

            trans = hash_entry_val(itor->ent);
            for (gn = trans; gn; gn = gnode_next(gn)) {
                fsg_link_t *fl = gnode_ptr(gn);
                if (fl->wid == basewid) {
                    fsg_link_t *link;

                    /* Create transition object */
                    link = listelem_malloc(fsg->link_alloc);
                    link->from_state = fl->from_state;
                    link->to_state = fl->to_state;
                    link->logs2prob = fl->logs2prob;    /* FIXME!!!??? */
                    link->wid = altwid;

                    trans = glist_add_ptr(trans, (void *) link);
                    ++ntrans;
                }
            }
            hash_entry_val(itor->ent) = trans;
        }
    }

    E_DEBUG("Added %d alternate word transitions\n", ntrans);
    return ntrans;
}